

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O2

void __thiscall ki::dml::Field<int>::~Field(Field<int> *this)

{
  FieldBase::~FieldBase(&this->super_FieldBase);
  operator_delete(this,0x40);
  return;
}

Assistant:

virtual ~Field() = default;